

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::Logger::unregister_client(Logger *this,LoggerClient *c)

{
  int *piVar1;
  pair<std::_Rb_tree_iterator<GEO::SmartPointer<GEO::LoggerClient>_>,_std::_Rb_tree_iterator<GEO::SmartPointer<GEO::LoggerClient>_>_>
  pVar2;
  key_type local_10;
  
  if (c != (LoggerClient *)0x0) {
    piVar1 = &(c->super_Counted).nb_refs_;
    *piVar1 = *piVar1 + 1;
  }
  local_10.pointer_ = c;
  pVar2 = std::
          _Rb_tree<GEO::SmartPointer<GEO::LoggerClient>,_GEO::SmartPointer<GEO::LoggerClient>,_std::_Identity<GEO::SmartPointer<GEO::LoggerClient>_>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
          ::equal_range(&(this->clients_)._M_t,&local_10);
  std::
  _Rb_tree<GEO::SmartPointer<GEO::LoggerClient>,_GEO::SmartPointer<GEO::LoggerClient>,_std::_Identity<GEO::SmartPointer<GEO::LoggerClient>_>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
  ::_M_erase_aux(&(this->clients_)._M_t,(_Base_ptr)pVar2.first._M_node,
                 (_Base_ptr)pVar2.second._M_node);
  if (local_10.pointer_ != (LoggerClient *)0x0) {
    piVar1 = &((local_10.pointer_)->super_Counted).nb_refs_;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*((local_10.pointer_)->super_Counted)._vptr_Counted[1])();
    }
  }
  return;
}

Assistant:

void Logger::unregister_client(LoggerClient* c) {
        geo_debug_assert(clients_.find(c) != clients_.end());
	clients_.erase(c);
    }